

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *o,Literals *literals)

{
  long lVar1;
  bool bVar2;
  Literal *other;
  size_t sVar3;
  Iterator IVar4;
  Literal local_90;
  Literal local_78;
  size_t local_60;
  ulong local_58;
  Literals *local_50;
  Literal *local_48;
  ulong *local_40;
  ulong local_38;
  
  lVar1 = __tls_get_addr(&PTR_01129bd8);
  local_40 = (ulong *)(lVar1 + 0x818);
  local_38 = *local_40;
  *local_40 = local_38 + 1;
  if (local_38 + 1 < 100) {
    if (((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18 +
        (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed == 1) {
      Literal::Literal(&local_78,(literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
      operator<<(o,&local_78);
      Literal::~Literal(&local_78);
    }
    else {
      std::operator<<(o,'(');
      IVar4 = SmallVector<wasm::Literal,_1UL>::end(&literals->super_SmallVector<wasm::Literal,_1UL>)
      ;
      local_60 = IVar4.
                 super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                 .index;
      local_48 = (literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems;
      bVar2 = true;
      lVar1 = -0x18;
      local_58 = (ulong)IVar4.
                        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                        .parent ^ (ulong)literals;
      local_50 = literals;
      for (sVar3 = 0; local_60 != sVar3 || local_58 != 0; sVar3 = sVar3 + 1) {
        other = (Literal *)
                ((long)&((local_50->super_SmallVector<wasm::Literal,_1UL>).flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_start)->field_0 + lVar1);
        if (sVar3 == 0) {
          other = local_48;
        }
        if (99 < *local_40) {
          std::operator<<(o,"[..]");
          break;
        }
        if (!bVar2) {
          std::operator<<(o,", ");
        }
        Literal::Literal(&local_90,other);
        operator<<(o,&local_90);
        Literal::~Literal(&local_90);
        lVar1 = lVar1 + 0x18;
        bVar2 = false;
      }
      o = std::operator<<(o,')');
    }
    if (local_38 == 0) {
      *local_40 = 0;
    }
  }
  else {
    o = std::operator<<(o,"[..]");
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::Literals literals) {
  PrintLimiter limiter;

  if (limiter.stop()) {
    return o << "[..]";
  }

  if (literals.size() == 1) {
    return o << literals[0];
  }

  o << '(';
  bool first = true;
  for (auto& literal : literals) {
    if (limiter.stop()) {
      o << "[..]";
      break;
    }
    if (first) {
      first = false;
    } else {
      o << ", ";
    }
    o << literal;
  }
  return o << ')';
}